

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

void ChopUpSingleUncompressedStrip(TIFF *tif)

{
  TIFFDirEntry *dirent;
  uint64_t **parray;
  uint uVar1;
  undefined1 auVar2 [16];
  uint64_t uVar3;
  uint64_t stripbytes;
  toff_t tVar4;
  uint nstrips;
  uint nrows;
  
  dirent = &(tif->tif_dir).td_stripbytecount_entry;
  parray = &(tif->tif_dir).td_stripbytecount_p;
  uVar3 = _TIFFGetStrileOffsetOrByteCountValue(tif,0,dirent,parray,(int *)0x0);
  if ((uVar3 != 0) || (tif->tif_mode == 0)) {
    uVar3 = _TIFFGetStrileOffsetOrByteCountValue(tif,0,dirent,parray,(int *)0x0);
    if ((tif->tif_dir).td_planarconfig != 1) {
      __assert_fail("td->td_planarconfig == PLANARCONFIG_CONTIG",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                    ,0x1caa,"void ChopUpSingleUncompressedStrip(TIFF *)");
    }
    nrows = 1;
    if (((tif->tif_dir).td_photometric == 6) && ((tif->tif_flags & 0x4000) == 0)) {
      nrows = (uint)(tif->tif_dir).td_ycbcrsubsampling[1];
    }
    stripbytes = TIFFVTileSize64(tif,nrows);
    if (stripbytes < 0x2001) {
      if (stripbytes == 0) {
        return;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = stripbytes;
      auVar2 = (ZEXT816(0) << 0x40 | ZEXT816(0x2000)) / auVar2;
      nrows = nrows * auVar2._0_4_;
      stripbytes = stripbytes * auVar2._0_8_;
    }
    if (nrows < (tif->tif_dir).td_rowsperstrip) {
      uVar1 = (tif->tif_dir).td_imagelength;
      nstrips = 0;
      if (uVar1 < -nrows) {
        nstrips = ((uVar1 + nrows) - 1) / nrows;
      }
      if ((nstrips != 0) &&
         (((nstrips < 0xf4241 || (tif->tif_mode != 0)) ||
          ((tVar4 = (*tif->tif_sizeproc)(tif->tif_clientdata), uVar3 < tVar4 &&
           (tVar4 = (*tif->tif_sizeproc)(tif->tif_clientdata),
           stripbytes <= (tVar4 - uVar3) / (ulong)(nstrips - 1))))))) {
        allocChoppedUpStripArrays(tif,nstrips,stripbytes,nrows);
        return;
      }
    }
  }
  return;
}

Assistant:

static void ChopUpSingleUncompressedStrip(TIFF *tif)
{
    register TIFFDirectory *td = &tif->tif_dir;
    uint64_t bytecount;
    uint64_t offset;
    uint32_t rowblock;
    uint64_t rowblockbytes;
    uint64_t stripbytes;
    uint32_t nstrips;
    uint32_t rowsperstrip;

    bytecount = TIFFGetStrileByteCount(tif, 0);
    /* On a newly created file, just re-opened to be filled, we */
    /* don't want strip chop to trigger as it is going to cause issues */
    /* later ( StripOffsets and StripByteCounts improperly filled) . */
    if (bytecount == 0 && tif->tif_mode != O_RDONLY)
        return;
    offset = TIFFGetStrileByteCount(tif, 0);
    assert(td->td_planarconfig == PLANARCONFIG_CONTIG);
    if ((td->td_photometric == PHOTOMETRIC_YCBCR) && (!isUpSampled(tif)))
        rowblock = td->td_ycbcrsubsampling[1];
    else
        rowblock = 1;
    rowblockbytes = TIFFVTileSize64(tif, rowblock);
    /*
     * Make the rows hold at least one scanline, but fill specified amount
     * of data if possible.
     */
    if (rowblockbytes > STRIP_SIZE_DEFAULT)
    {
        stripbytes = rowblockbytes;
        rowsperstrip = rowblock;
    }
    else if (rowblockbytes > 0)
    {
        uint32_t rowblocksperstrip;
        rowblocksperstrip = (uint32_t)(STRIP_SIZE_DEFAULT / rowblockbytes);
        rowsperstrip = rowblocksperstrip * rowblock;
        stripbytes = rowblocksperstrip * rowblockbytes;
    }
    else
        return;

    /*
     * never increase the number of rows per strip
     */
    if (rowsperstrip >= td->td_rowsperstrip)
        return;
    nstrips = TIFFhowmany_32(td->td_imagelength, rowsperstrip);
    if (nstrips == 0)
        return;

    /* If we are going to allocate a lot of memory, make sure that the */
    /* file is as big as needed */
    if (tif->tif_mode == O_RDONLY && nstrips > 1000000 &&
        (offset >= TIFFGetFileSize(tif) ||
         stripbytes > (TIFFGetFileSize(tif) - offset) / (nstrips - 1)))
    {
        return;
    }

    allocChoppedUpStripArrays(tif, nstrips, stripbytes, rowsperstrip);
}